

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

ALLEGRO_USTR * al_path_ustr(ALLEGRO_PATH *path,char delim)

{
  long in_RDI;
  ALLEGRO_USTR *unaff_retaddr;
  undefined3 in_stack_0000000c;
  
  path_to_ustr(path,_in_stack_0000000c,unaff_retaddr);
  return *(ALLEGRO_USTR **)(in_RDI + 0x38);
}

Assistant:

const ALLEGRO_USTR *al_path_ustr(const ALLEGRO_PATH *path, char delim)
{
   path_to_ustr(path, delim, path->full_string);
   return path->full_string;
}